

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VDotProdMultiLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  sunrealtype dotprods [3];
  
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0x4000000000000000,X);
  N_VConst(0x3fe0000000000000,*puVar4);
  dVar6 = get_time();
  iVar5 = 1;
  iVar1 = N_VDotProdMultiLocal(1,X,puVar4,dotprods);
  sync_device(X);
  dVar7 = get_time();
  dVar8 = (double)param_2;
  if (iVar1 == 0) {
    iVar1 = SUNRCompare(dotprods[0],dVar8);
    if (iVar1 != 0) goto LAB_0010c3fd;
    iVar5 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdMultiLocal Case 1 ");
    }
  }
  else {
LAB_0010c3fd:
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n",(ulong)(uint)myid);
  }
  max_time(X,dVar7 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  N_VConst(0x4000000000000000,X);
  N_VConst(0xbfe0000000000000,*puVar4);
  N_VConst(0x3fe0000000000000,puVar4[1]);
  N_VConst(0x3ff0000000000000,puVar4[2]);
  dVar6 = get_time();
  iVar1 = N_VDotProdMultiLocal(3,X,puVar4,dotprods);
  sync_device(X);
  dVar7 = get_time();
  if (iVar1 == 0) {
    iVar1 = SUNRCompare(dotprods[0],-dVar8);
    iVar2 = SUNRCompare(dotprods[1],dVar8);
    iVar3 = SUNRCompare(dotprods[2],dVar8 + dVar8);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VDotProdMultiLocal Case 2 ");
      }
      goto LAB_0010c529;
    }
  }
  printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n",(ulong)(uint)myid);
  iVar5 = iVar5 + 1;
LAB_0010c529:
  max_time(X,dVar7 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  N_VDestroyVectorArray(puVar4,3);
  return iVar5;
}

Assistant:

int Test_N_VDotProdMultiLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  N_Vector* V;
  sunrealtype dotprods[3];

  /* create vectors for testing */
  V = N_VCloneVectorArray(3, X);

  /*
   * Case 1: d[0] = z . V[0], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, V[0]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(1, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /*
   * Case 2: d[i] = z . V[i], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, V[0]);
  N_VConst(HALF, V[1]);
  N_VConst(ONE, V[2]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(3, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * local_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)local_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(V, 3);

  return (fails);
}